

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_cHRM_fixed(png_structrp png_ptr,png_xy *xy)

{
  png_byte local_38 [4];
  png_byte apStack_34 [4];
  png_byte buf [32];
  png_xy *xy_local;
  png_structrp png_ptr_local;
  
  buf._24_8_ = xy;
  png_save_int_32(local_38,xy->whitex);
  png_save_int_32(apStack_34,*(png_int_32 *)(buf._24_8_ + 0x1c));
  png_save_int_32(buf,*(png_int_32 *)buf._24_8_);
  png_save_int_32(buf + 4,*(png_int_32 *)(buf._24_8_ + 4));
  png_save_int_32(buf + 8,*(png_int_32 *)(buf._24_8_ + 8));
  png_save_int_32(buf + 0xc,*(png_int_32 *)(buf._24_8_ + 0xc));
  png_save_int_32(buf + 0x10,*(png_int_32 *)(buf._24_8_ + 0x10));
  png_save_int_32(buf + 0x14,*(png_int_32 *)(buf._24_8_ + 0x14));
  png_write_complete_chunk(png_ptr,0x6348524d,local_38,0x20);
  return;
}

Assistant:

void /* PRIVATE */
png_write_cHRM_fixed(png_structrp png_ptr, const png_xy *xy)
{
   png_byte buf[32];

   png_debug(1, "in png_write_cHRM");

   /* Each value is saved in 1/100,000ths */
   png_save_int_32(buf,      xy->whitex);
   png_save_int_32(buf +  4, xy->whitey);

   png_save_int_32(buf +  8, xy->redx);
   png_save_int_32(buf + 12, xy->redy);

   png_save_int_32(buf + 16, xy->greenx);
   png_save_int_32(buf + 20, xy->greeny);

   png_save_int_32(buf + 24, xy->bluex);
   png_save_int_32(buf + 28, xy->bluey);

   png_write_complete_chunk(png_ptr, png_cHRM, buf, 32);
}